

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transit.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Transit::exportKey
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Transit *this,KeyType *keyType,Path *path,Path *version)

{
  Client *client;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  Url local_50;
  Path *local_30;
  Path *version_local;
  Path *path_local;
  KeyType *keyType_local;
  Transit *this_local;
  
  client = *(Client **)this;
  local_30 = version;
  version_local = path;
  path_local = (Path *)keyType;
  keyType_local = (KeyType *)this;
  this_local = (Transit *)__return_storage_ptr__;
  Vault::operator+(&local_110,"export/",keyType);
  std::operator+(&local_f0,&local_110,"/");
  Vault::operator+(&local_d0,&local_f0,version_local);
  std::operator+(&local_b0,&local_d0,"/");
  Vault::operator+(&local_90,&local_b0,local_30);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_70,&local_90);
  getUrl(&local_50,this,&local_70);
  HttpConsumer::get(__return_storage_ptr__,client,&local_50);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_50);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Transit::exportKey(const KeyType &keyType,
                                                     const Path &path,
                                                     const Path &version) {
  return HttpConsumer::get(
      client_, getUrl(Path{"export/" + keyType + "/" + path + "/" + version}));
}